

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O0

void BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,Command *cmds,
               size_t num_commands,ContextType literal_context_mode,MetaBlockSplit *mb)

{
  size_t sVar1;
  HistogramCommand *pHVar2;
  bool bVar3;
  int iVar4;
  MemoryManager *in_size;
  HistogramLiteral *__s;
  ulong uVar5;
  HistogramDistance *__s_00;
  HistogramCommand *__s_01;
  HistogramDistance *local_270;
  uint32_t *local_268;
  HistogramLiteral *local_260;
  uint32_t *local_258;
  HistogramCommand *local_250;
  HistogramDistance *local_248;
  HistogramLiteral *local_240;
  void *local_238;
  ulong local_230;
  size_t j;
  double dist_cost_1;
  double dist_cost;
  int skip;
  uint32_t ndirect;
  BrotliEncoderParams new_params;
  BrotliEncoderParams orig_params;
  double best_dist_cost;
  uint local_100;
  int check_orig;
  uint32_t ndirect_msb;
  uint32_t npostfix;
  size_t literal_context_multiplier;
  size_t i;
  size_t distance_histograms_size;
  size_t literal_histograms_size;
  ContextType *literal_context_modes;
  HistogramLiteral *literal_histograms;
  HistogramDistance *distance_histograms;
  uint8_t prev_byte_local;
  BrotliEncoderParams *params_local;
  size_t mask_local;
  size_t pos_local;
  uint8_t *ringbuffer_local;
  MemoryManager *m_local;
  size_t i_1;
  ulong local_78;
  size_t i_2;
  ulong local_60;
  size_t i_3;
  
  literal_histograms_size = 0;
  _ndirect_msb = 1;
  local_100 = 0;
  bVar3 = true;
  orig_params.dictionary.dict_words = (DictWord *)0x547d42aea2879f2e;
  memcpy(&new_params.dictionary.dict_words,params,0x80);
  memcpy(&skip,params,0x80);
  check_orig = 0;
  do {
    if (3 < (uint)check_orig) {
      if ((bVar3) &&
         (ComputeDistanceCost(cmds,num_commands,
                              (BrotliDistanceParams *)
                              &orig_params.hasher.num_last_distances_to_check,
                              (BrotliDistanceParams *)
                              &orig_params.hasher.num_last_distances_to_check,(double *)&j),
         (double)j < (double)orig_params.dictionary.dict_words)) {
        orig_params.dictionary.dict_words = (DictWord *)j;
        (params->dist).distance_postfix_bits = orig_params.hasher.num_last_distances_to_check;
        (params->dist).num_direct_distance_codes = orig_params._52_4_;
        (params->dist).alphabet_size = orig_params.dist.distance_postfix_bits;
        *(uint32_t *)&(params->dist).field_0xc = orig_params.dist.num_direct_distance_codes;
        (params->dist).max_distance = orig_params.dist._8_8_;
      }
      RecomputeDistancePrefixes
                (cmds,num_commands,
                 (BrotliDistanceParams *)&orig_params.hasher.num_last_distances_to_check,
                 &params->dist);
      BrotliSplitBlock(m,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                       &mb->command_split,&mb->distance_split);
      if (params->disable_literal_context_modeling == 0) {
        _ndirect_msb = 0x40;
        if ((mb->literal_split).num_types == 0) {
          local_238 = (void *)0x0;
        }
        else {
          local_238 = BrotliAllocate(m,(mb->literal_split).num_types << 2);
        }
        literal_histograms_size = (size_t)local_238;
        for (literal_context_multiplier = 0;
            literal_context_multiplier < (mb->literal_split).num_types;
            literal_context_multiplier = literal_context_multiplier + 1) {
          *(ContextType *)((long)local_238 + literal_context_multiplier * 4) = literal_context_mode;
        }
      }
      in_size = (MemoryManager *)((mb->literal_split).num_types * _ndirect_msb);
      if (in_size == (MemoryManager *)0x0) {
        local_240 = (HistogramLiteral *)0x0;
      }
      else {
        local_240 = (HistogramLiteral *)BrotliAllocate(m,(long)in_size * 0x410);
      }
      for (m_local = (MemoryManager *)0x0; m_local < in_size;
          m_local = (MemoryManager *)((long)&m_local->alloc_func + 1)) {
        __s = local_240 + (long)m_local;
        memset(__s,0,0x400);
        __s->total_count_ = 0;
        __s->bit_cost_ = INFINITY;
      }
      sVar1 = (mb->distance_split).num_types;
      uVar5 = sVar1 * 4;
      if (uVar5 == 0) {
        local_248 = (HistogramDistance *)0x0;
      }
      else {
        local_248 = (HistogramDistance *)BrotliAllocate(m,sVar1 * 0x2240);
      }
      for (local_78 = 0; local_78 < uVar5; local_78 = local_78 + 1) {
        __s_00 = local_248 + local_78;
        memset(__s_00,0,0x880);
        __s_00->total_count_ = 0;
        __s_00->bit_cost_ = INFINITY;
      }
      mb->command_histograms_size = (mb->command_split).num_types;
      if (mb->command_histograms_size == 0) {
        local_250 = (HistogramCommand *)0x0;
      }
      else {
        local_250 = (HistogramCommand *)BrotliAllocate(m,mb->command_histograms_size * 0xb10);
      }
      mb->command_histograms = local_250;
      pHVar2 = mb->command_histograms;
      uVar5 = mb->command_histograms_size;
      for (local_60 = 0; local_60 < uVar5; local_60 = local_60 + 1) {
        __s_01 = pHVar2 + local_60;
        memset(__s_01,0,0xb00);
        __s_01->total_count_ = 0;
        __s_01->bit_cost_ = INFINITY;
      }
      BrotliBuildHistogramsWithContext
                (cmds,num_commands,&mb->literal_split,&mb->command_split,&mb->distance_split,
                 ringbuffer,pos,mask,prev_byte,prev_byte2,(ContextType *)literal_histograms_size,
                 local_240,mb->command_histograms,local_248);
      BrotliFree(m,(void *)literal_histograms_size);
      mb->literal_context_map_size = (mb->literal_split).num_types << 6;
      if (mb->literal_context_map_size == 0) {
        local_258 = (uint32_t *)0x0;
      }
      else {
        local_258 = (uint32_t *)BrotliAllocate(m,mb->literal_context_map_size << 2);
      }
      mb->literal_context_map = local_258;
      mb->literal_histograms_size = mb->literal_context_map_size;
      if (mb->literal_histograms_size == 0) {
        local_260 = (HistogramLiteral *)0x0;
      }
      else {
        local_260 = (HistogramLiteral *)BrotliAllocate(m,mb->literal_histograms_size * 0x410);
      }
      mb->literal_histograms = local_260;
      BrotliClusterHistogramsLiteral
                (m,local_240,(size_t)in_size,0x100,mb->literal_histograms,
                 &mb->literal_histograms_size,mb->literal_context_map);
      BrotliFree(m,local_240);
      if (params->disable_literal_context_modeling != 0) {
        literal_context_multiplier = (mb->literal_split).num_types;
        while (literal_context_multiplier != 0) {
          literal_context_multiplier = literal_context_multiplier - 1;
          for (local_230 = 0; local_230 < 0x40; local_230 = local_230 + 1) {
            mb->literal_context_map[literal_context_multiplier * 0x40 + local_230] =
                 mb->literal_context_map[literal_context_multiplier];
          }
        }
      }
      mb->distance_context_map_size = (mb->distance_split).num_types << 2;
      if (mb->distance_context_map_size == 0) {
        local_268 = (uint32_t *)0x0;
      }
      else {
        local_268 = (uint32_t *)BrotliAllocate(m,mb->distance_context_map_size << 2);
      }
      mb->distance_context_map = local_268;
      mb->distance_histograms_size = mb->distance_context_map_size;
      if (mb->distance_histograms_size == 0) {
        local_270 = (HistogramDistance *)0x0;
      }
      else {
        local_270 = (HistogramDistance *)BrotliAllocate(m,mb->distance_histograms_size * 0x890);
      }
      mb->distance_histograms = local_270;
      BrotliClusterHistogramsDistance
                (m,local_248,mb->distance_context_map_size,0x100,mb->distance_histograms,
                 &mb->distance_histograms_size,mb->distance_context_map);
      BrotliFree(m,local_248);
      return;
    }
    for (; local_100 < 0x10; local_100 = local_100 + 1) {
      dist_cost._4_4_ = local_100 << ((byte)check_orig & 0x1f);
      BrotliInitDistanceParams((BrotliEncoderParams *)&skip,check_orig,dist_cost._4_4_);
      if ((check_orig == orig_params.hasher.num_last_distances_to_check) &&
         (dist_cost._4_4_ == orig_params._52_4_)) {
        bVar3 = false;
      }
      iVar4 = ComputeDistanceCost(cmds,num_commands,
                                  (BrotliDistanceParams *)
                                  &orig_params.hasher.num_last_distances_to_check,
                                  (BrotliDistanceParams *)
                                  &new_params.hasher.num_last_distances_to_check,&dist_cost_1);
      dist_cost._0_4_ = (uint)((iVar4 != 0 ^ 0xffU) & 1);
      if ((dist_cost._0_4_ != 0) || ((double)orig_params.dictionary.dict_words < dist_cost_1))
      break;
      orig_params.dictionary.dict_words = (DictWord *)dist_cost_1;
      (params->dist).distance_postfix_bits = new_params.hasher.num_last_distances_to_check;
      (params->dist).num_direct_distance_codes = new_params._52_4_;
      (params->dist).alphabet_size = new_params.dist.distance_postfix_bits;
      *(uint32_t *)&(params->dist).field_0xc = new_params.dist.num_direct_distance_codes;
      (params->dist).max_distance = new_params.dist._8_8_;
    }
    if (local_100 != 0) {
      local_100 = local_100 - 1;
    }
    local_100 = local_100 >> 1;
    check_orig = check_orig + 1;
  } while( true );
}

Assistant:

void BrotliBuildMetaBlock(MemoryManager* m,
                          const uint8_t* ringbuffer,
                          const size_t pos,
                          const size_t mask,
                          BrotliEncoderParams* params,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          Command* cmds,
                          size_t num_commands,
                          ContextType literal_context_mode,
                          MetaBlockSplit* mb) {
  /* Histogram ids need to fit in one byte. */
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliEncoderParams orig_params = *params;
  BrotliEncoderParams new_params = *params;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect);
      if (npostfix == orig_params.dist.distance_postfix_bits &&
          ndirect == orig_params.dist.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands,
          &orig_params.dist, &new_params.dist, &dist_cost);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params.dist;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands,
                        &orig_params.dist, &orig_params.dist, &dist_cost);
    if (dist_cost < best_dist_cost) {
      best_dist_cost = dist_cost;
      params->dist = orig_params.dist;
    }
  }
  RecomputeDistancePrefixes(cmds, num_commands,
                            &orig_params.dist, &params->dist);

  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split);
  if (BROTLI_IS_OOM(m)) return;

  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }

  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);

  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);

  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);

  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }

  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}